

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# macro_function.cpp
# Opt level: O3

MacroBindResult *
duckdb::MacroFunction::BindMacroFunction
          (MacroBindResult *__return_storage_ptr__,
          vector<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>,_true>
          *functions,string *name,FunctionExpression *function_expr,
          vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
          *positionals,
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>_>
          *defaults)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer puVar3;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var4;
  pointer puVar5;
  pointer pcVar6;
  undefined8 uVar7;
  pointer pPVar8;
  const_iterator cVar9;
  mapped_type *pmVar10;
  const_reference pvVar11;
  pointer pMVar12;
  idx_t __n;
  iterator iVar13;
  long *plVar14;
  type pMVar15;
  undefined8 *puVar16;
  size_type *psVar17;
  __node_base *p_Var18;
  long lVar19;
  _Hash_node_base *p_Var20;
  pointer this;
  size_type __n_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_1;
  pointer this_00;
  string error;
  optional_idx result_idx;
  string local_280;
  undefined1 local_260 [32];
  string *local_240;
  optional_idx local_238;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_230;
  char local_220 [16];
  char *local_210;
  size_type local_208;
  char local_200;
  undefined7 uStack_1ff;
  undefined8 uStack_1f8;
  char *local_1f0;
  size_type local_1e8;
  char local_1e0;
  undefined7 uStack_1df;
  undefined8 uStack_1d8;
  string local_1d0;
  string local_1b0;
  string local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  string local_150;
  undefined1 *local_130 [2];
  undefined1 local_120 [16];
  string local_110;
  undefined1 *local_f0 [2];
  undefined1 local_e0 [16];
  undefined1 *local_d0 [2];
  undefined1 local_c0 [16];
  string local_b0;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  string local_70;
  size_type *local_50;
  size_type local_48;
  size_type local_40;
  undefined8 uStack_38;
  
  puVar3 = (function_expr->children).
           super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  params_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)positionals;
  local_240 = name;
  for (this = (function_expr->children).
              super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start; this != puVar3; this = this + 1) {
    pPVar8 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             ::operator->(this);
    if ((pPVar8->super_BaseExpression).alias._M_string_length == 0) {
      if ((defaults->_M_h)._M_element_count != 0) {
        local_50 = &local_40;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,
                   "Positional parameters cannot come after parameters with a default value!","");
        (__return_storage_ptr__->function_idx).index = 0xffffffffffffffff;
        paVar1 = &(__return_storage_ptr__->error).field_2;
        (__return_storage_ptr__->error)._M_dataplus._M_p = (pointer)paVar1;
        if (local_50 == &local_40) {
          paVar1->_M_allocated_capacity = local_40;
          *(undefined8 *)((long)&(__return_storage_ptr__->error).field_2 + 8) = uStack_38;
        }
        else {
          (__return_storage_ptr__->error)._M_dataplus._M_p = (pointer)local_50;
          (__return_storage_ptr__->error).field_2._M_allocated_capacity = local_40;
        }
        (__return_storage_ptr__->error)._M_string_length = local_48;
        return __return_storage_ptr__;
      }
      ::std::
      vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                  *)positionals,this);
    }
    else {
      pPVar8 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
               ::operator->(this);
      cVar9 = ::std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&defaults->_M_h,&(pPVar8->super_BaseExpression).alias);
      if (cVar9.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>,_true>
          ._M_cur != (__node_type *)0x0) {
        local_90[0] = local_80;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_90,"Duplicate default parameters %s!","");
        pPVar8 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                 ::operator->(this);
        pcVar6 = (pPVar8->super_BaseExpression).alias._M_dataplus._M_p;
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_b0,pcVar6,
                   pcVar6 + (pPVar8->super_BaseExpression).alias._M_string_length);
        StringUtil::Format<std::__cxx11::string>
                  (&local_1d0,(StringUtil *)local_90,&local_b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   function_expr);
        (__return_storage_ptr__->function_idx).index = 0xffffffffffffffff;
        paVar1 = &(__return_storage_ptr__->error).field_2;
        (__return_storage_ptr__->error)._M_dataplus._M_p = (pointer)paVar1;
        paVar2 = &local_1d0.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d0._M_dataplus._M_p == paVar2) {
          paVar1->_M_allocated_capacity =
               CONCAT71(local_1d0.field_2._M_allocated_capacity._1_7_,
                        local_1d0.field_2._M_local_buf[0]);
          *(undefined8 *)((long)&(__return_storage_ptr__->error).field_2 + 8) =
               local_1d0.field_2._8_8_;
        }
        else {
          (__return_storage_ptr__->error)._M_dataplus._M_p = local_1d0._M_dataplus._M_p;
          (__return_storage_ptr__->error).field_2._M_allocated_capacity =
               CONCAT71(local_1d0.field_2._M_allocated_capacity._1_7_,
                        local_1d0.field_2._M_local_buf[0]);
        }
        (__return_storage_ptr__->error)._M_string_length = local_1d0._M_string_length;
        local_1d0._M_string_length = 0;
        local_1d0.field_2._M_local_buf[0] = '\0';
        local_1d0._M_dataplus._M_p = (pointer)paVar2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p);
        }
        if (local_90[0] == local_80) {
          return __return_storage_ptr__;
        }
        operator_delete(local_90[0]);
        return __return_storage_ptr__;
      }
      pPVar8 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
               ::operator->(this);
      pmVar10 = ::std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)defaults,&(pPVar8->super_BaseExpression).alias);
      function_expr =
           (FunctionExpression *)
           (this->
           super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
           )._M_t.
           super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
           .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
      (this->
      super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>).
      _M_t.
      super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
      .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
           (ParsedExpression *)0x0;
      _Var4._M_head_impl =
           (pmVar10->
           super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
           )._M_t.
           super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
           .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
      (pmVar10->
      super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>).
      _M_t.
      super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
      .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
           (ParsedExpression *)function_expr;
      if (_Var4._M_head_impl != (ParsedExpression *)0x0) {
        (**(code **)(*(long *)&(_Var4._M_head_impl)->super_BaseExpression + 8))();
      }
    }
  }
  local_238.index = 0xffffffffffffffff;
  if ((functions->
      super_vector<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>_>_>
      ).
      super__Vector_base<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (functions->
      super_vector<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>_>_>
      ).
      super__Vector_base<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    __n_00 = 0;
    do {
      pvVar11 = vector<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>,_true>
                ::operator[](functions,__n_00);
      pMVar12 = unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>
                ::operator->(pvVar11);
      function_expr =
           (FunctionExpression *)
           ((long)(pMVar12->parameters).
                  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                  .
                  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
           (long)(pMVar12->parameters).
                 super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start);
      if (function_expr ==
          (FunctionExpression *)
          ((long)(positionals->
                 super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                 ).
                 super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
          (long)(positionals->
                super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                ).
                super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_start)) {
        optional_idx::optional_idx((optional_idx *)local_260,__n_00);
        local_238.index = local_260._0_8_;
        if ((ParsedExpression *)local_260._0_8_ != (ParsedExpression *)0xffffffffffffffff) {
          __n = optional_idx::GetIndex(&local_238);
          pvVar11 = vector<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>,_true>
                    ::operator[](functions,__n);
          pMVar15 = unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>
                    ::operator*(pvVar11);
          p_Var18 = &(defaults->_M_h)._M_before_begin;
          do {
            p_Var18 = p_Var18->_M_nxt;
            if (p_Var18 == (__node_base *)0x0) {
              p_Var20 = (pMVar15->default_parameters)._M_h._M_before_begin._M_nxt;
              if (p_Var20 != (_Hash_node_base *)0x0) {
                do {
                  cVar9 = ::std::
                          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                          ::find(&defaults->_M_h,(key_type *)(p_Var20 + 1));
                  if (cVar9.
                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>,_true>
                      ._M_cur == (__node_type *)0x0) {
                    pPVar8 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                             ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                                           *)(p_Var20 + 5));
                    (*(pPVar8->super_BaseExpression)._vptr_BaseExpression[0xc])(local_260,pPVar8);
                    pmVar10 = ::std::__detail::
                              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                            *)defaults,(key_type *)(p_Var20 + 1));
                    uVar7 = local_260._0_8_;
                    local_260._0_8_ = (ParsedExpression *)0x0;
                    _Var4._M_head_impl =
                         (pmVar10->
                         super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                         )._M_t.
                         super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                         .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
                    (pmVar10->
                    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                    )._M_t.
                    super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
                         (ParsedExpression *)uVar7;
                    if (_Var4._M_head_impl != (ParsedExpression *)0x0) {
                      (**(code **)(*(long *)&(_Var4._M_head_impl)->super_BaseExpression + 8))();
                    }
                    if ((ParsedExpression *)local_260._0_8_ != (ParsedExpression *)0x0) {
                      (**(code **)(*(long *)local_260._0_8_ + 8))();
                    }
                  }
                  p_Var20 = p_Var20->_M_nxt;
                } while (p_Var20 != (_Hash_node_base *)0x0);
              }
              optional_idx::optional_idx(&__return_storage_ptr__->function_idx,__n);
              (__return_storage_ptr__->error)._M_dataplus._M_p =
                   (pointer)&(__return_storage_ptr__->error).field_2;
              (__return_storage_ptr__->error)._M_string_length = 0;
              (__return_storage_ptr__->error).field_2._M_local_buf[0] = '\0';
              return __return_storage_ptr__;
            }
            iVar13 = ::std::
                     _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     ::find(&(pMVar15->default_parameters)._M_h,(key_type *)(p_Var18 + 1));
          } while (iVar13.
                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>,_true>
                   ._M_cur != (__node_type *)0x0);
          local_130[0] = local_120;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_130,"Macro \"%s\" does not have a named parameter \"%s\"\n","")
          ;
          pcVar6 = (local_240->_M_dataplus)._M_p;
          local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_150,pcVar6,pcVar6 + local_240->_M_string_length);
          local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_170,p_Var18[1]._M_nxt,
                     (long)&(*(_Hash_node_base **)
                              &((_Prime_rehash_policy *)(p_Var18 + 2))->_M_max_load_factor)->_M_nxt
                     + (long)p_Var18[1]._M_nxt);
          StringUtil::Format<std::__cxx11::string,std::__cxx11::string>
                    ((string *)local_260,(StringUtil *)local_130,&local_150,&local_170,params_1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_170._M_dataplus._M_p != &local_170.field_2) {
            operator_delete(local_170._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_150._M_dataplus._M_p != &local_150.field_2) {
            operator_delete(local_150._M_dataplus._M_p);
          }
          if (local_130[0] != local_120) {
            operator_delete(local_130[0]);
          }
          FormatMacroFunction((string *)&local_230,pMVar15,local_240);
          plVar14 = (long *)::std::__cxx11::string::replace
                                      ((ulong)&local_230,0,(char *)0x0,0x1d96a09);
          psVar17 = (size_type *)(plVar14 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar14 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar17) {
            local_280.field_2._M_allocated_capacity = *psVar17;
            local_280.field_2._8_8_ = plVar14[3];
            local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
          }
          else {
            local_280.field_2._M_allocated_capacity = *psVar17;
            local_280._M_dataplus._M_p = (pointer)*plVar14;
          }
          local_280._M_string_length = plVar14[1];
          *plVar14 = (long)psVar17;
          plVar14[1] = 0;
          *(undefined1 *)(plVar14 + 2) = 0;
          ::std::__cxx11::string::_M_append(local_260,(ulong)local_280._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_280._M_dataplus._M_p != &local_280.field_2) {
            operator_delete(local_280._M_dataplus._M_p);
          }
          if ((char *)local_230._M_allocated_capacity != local_220) {
            operator_delete((void *)local_230._M_allocated_capacity);
          }
          local_210 = &local_200;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_210,local_260._0_8_,
                     (pointer)(local_260._0_8_ + local_260._8_8_));
          (__return_storage_ptr__->function_idx).index = 0xffffffffffffffff;
          paVar1 = &(__return_storage_ptr__->error).field_2;
          (__return_storage_ptr__->error)._M_dataplus._M_p = (pointer)paVar1;
          if (local_210 == &local_200) {
            paVar1->_M_allocated_capacity = CONCAT71(uStack_1ff,local_200);
            *(undefined8 *)((long)&(__return_storage_ptr__->error).field_2 + 8) = uStack_1f8;
          }
          else {
            (__return_storage_ptr__->error)._M_dataplus._M_p = local_210;
            (__return_storage_ptr__->error).field_2._M_allocated_capacity =
                 CONCAT71(uStack_1ff,local_200);
          }
          (__return_storage_ptr__->error)._M_string_length = local_208;
          local_208 = 0;
          local_200 = '\0';
          local_210 = &local_200;
          goto LAB_00d20ce7;
        }
        break;
      }
      __n_00 = __n_00 + 1;
    } while (__n_00 < (ulong)((long)(functions->
                                    super_vector<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>_>_>
                                    ).
                                    super__Vector_base<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(functions->
                                    super_vector<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>_>_>
                                    ).
                                    super__Vector_base<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  local_260._0_8_ = local_260 + 0x10;
  local_260._8_8_ = 0;
  local_260[0x10] = '\0';
  if ((long)(functions->
            super_vector<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>_>_>
            ).
            super__Vector_base<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(functions->
            super_vector<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>_>_>
            ).
            super__Vector_base<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start == 8) {
    pvVar11 = vector<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>,_true>
              ::operator[](functions,0);
    pMVar15 = unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>::
              operator*(pvVar11);
    local_d0[0] = local_c0;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_d0,"Macro function %s requires ","");
    FormatMacroFunction(&local_70,pMVar15,local_240);
    StringUtil::Format<std::__cxx11::string>
              (&local_280,(StringUtil *)local_d0,&local_70,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)function_expr);
    ::std::__cxx11::string::operator=((string *)local_260,(string *)&local_280);
    paVar1 = &local_280.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != paVar1) {
      operator_delete(local_280._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if (local_d0[0] != local_c0) {
      operator_delete(local_d0[0]);
    }
    lVar19 = (long)(pMVar15->parameters).
                   super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                   .
                   super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(pMVar15->parameters).
                   super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                   .
                   super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    if (lVar19 == 8) {
      local_280._M_dataplus._M_p = (pointer)paVar1;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_280,"a single positional argument","");
    }
    else {
      local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_190,"%i positional arguments","");
      Exception::ConstructMessage<unsigned_long>
                (&local_280,&local_190,
                 (long)(pMVar15->parameters).
                       super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                       .
                       super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(pMVar15->parameters).
                       super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                       .
                       super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3);
    }
    ::std::__cxx11::string::_M_append(local_260,(ulong)local_280._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != paVar1) {
      operator_delete(local_280._M_dataplus._M_p);
    }
    if ((lVar19 != 8) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_dataplus._M_p != &local_190.field_2)) {
      operator_delete(local_190._M_dataplus._M_p);
    }
    ::std::__cxx11::string::append(local_260);
    lVar19 = (long)(positionals->
                   super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                   ).
                   super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(positionals->
                   super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                   ).
                   super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    if (lVar19 == 8) {
      local_280._M_dataplus._M_p = (pointer)paVar1;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_280,"a single positional argument was","");
    }
    else {
      local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1b0,"%i positional arguments were","");
      Exception::ConstructMessage<unsigned_long>
                (&local_280,&local_1b0,
                 (long)(positionals->
                       super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                       ).
                       super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(positionals->
                       super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                       ).
                       super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3);
    }
    ::std::__cxx11::string::_M_append(local_260,(ulong)local_280._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != paVar1) {
      operator_delete(local_280._M_dataplus._M_p);
    }
    if ((lVar19 != 8) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._M_dataplus._M_p != &local_1b0.field_2)) {
      operator_delete(local_1b0._M_dataplus._M_p);
    }
    ::std::__cxx11::string::append(local_260);
  }
  else {
    local_f0[0] = local_e0;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_f0,"Macro \"%s\" does not support %llu parameters.\n","");
    pcVar6 = (local_240->_M_dataplus)._M_p;
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_110,pcVar6,pcVar6 + local_240->_M_string_length);
    StringUtil::Format<std::__cxx11::string,unsigned_long>
              (&local_280,(StringUtil *)local_f0,&local_110,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)(positionals->
                      super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                      ).
                      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(positionals->
                      super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                      ).
                      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3),(unsigned_long)params_1);
    ::std::__cxx11::string::_M_append(local_260,(ulong)local_280._M_dataplus._M_p);
    paVar1 = &local_280.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != paVar1) {
      operator_delete(local_280._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p);
    }
    if (local_f0[0] != local_e0) {
      operator_delete(local_f0[0]);
    }
    ::std::__cxx11::string::append(local_260);
    this_00 = (functions->
              super_vector<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>_>_>
              ).
              super__Vector_base<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar5 = (functions->
             super_vector<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>_>_>
             ).
             super__Vector_base<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (this_00 != puVar5) {
      do {
        pMVar15 = unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>
                  ::operator*(this_00);
        FormatMacroFunction((string *)&local_230,pMVar15,local_240);
        puVar16 = (undefined8 *)
                  ::std::__cxx11::string::replace((ulong)&local_230,0,(char *)0x0,0x1df8c24);
        psVar17 = puVar16 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar16 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar17) {
          local_280.field_2._M_allocated_capacity = *psVar17;
          local_280.field_2._8_8_ = puVar16[3];
          local_280._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_280.field_2._M_allocated_capacity = *psVar17;
          local_280._M_dataplus._M_p = (pointer)*puVar16;
        }
        local_280._M_string_length = puVar16[1];
        *puVar16 = psVar17;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        ::std::__cxx11::string::_M_append(local_260,(ulong)local_280._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_280._M_dataplus._M_p != paVar1) {
          operator_delete(local_280._M_dataplus._M_p);
        }
        if ((char *)local_230._M_allocated_capacity != local_220) {
          operator_delete((void *)local_230._M_allocated_capacity);
        }
        this_00 = this_00 + 1;
      } while (this_00 != puVar5);
    }
  }
  local_1f0 = &local_1e0;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1f0,local_260._0_8_,(pointer)(local_260._0_8_ + local_260._8_8_));
  (__return_storage_ptr__->function_idx).index = 0xffffffffffffffff;
  paVar1 = &(__return_storage_ptr__->error).field_2;
  (__return_storage_ptr__->error)._M_dataplus._M_p = (pointer)paVar1;
  if (local_1f0 == &local_1e0) {
    paVar1->_M_allocated_capacity = CONCAT71(uStack_1df,local_1e0);
    *(undefined8 *)((long)&(__return_storage_ptr__->error).field_2 + 8) = uStack_1d8;
  }
  else {
    (__return_storage_ptr__->error)._M_dataplus._M_p = local_1f0;
    (__return_storage_ptr__->error).field_2._M_allocated_capacity = CONCAT71(uStack_1df,local_1e0);
  }
  (__return_storage_ptr__->error)._M_string_length = local_1e8;
  local_1e8 = 0;
  local_1e0 = '\0';
  local_1f0 = &local_1e0;
LAB_00d20ce7:
  if ((ParsedExpression *)local_260._0_8_ != (ParsedExpression *)(local_260 + 0x10)) {
    operator_delete((void *)local_260._0_8_);
  }
  return __return_storage_ptr__;
}

Assistant:

MacroBindResult MacroFunction::BindMacroFunction(const vector<unique_ptr<MacroFunction>> &functions, const string &name,
                                                 FunctionExpression &function_expr,
                                                 vector<unique_ptr<ParsedExpression>> &positionals,
                                                 unordered_map<string, unique_ptr<ParsedExpression>> &defaults) {
	// separate positional and default arguments
	for (auto &arg : function_expr.children) {
		if (!arg->GetAlias().empty()) {
			// default argument
			if (defaults.count(arg->GetAlias())) {
				return MacroBindResult(StringUtil::Format("Duplicate default parameters %s!", arg->GetAlias()));
			}
			defaults[arg->GetAlias()] = std::move(arg);
		} else if (!defaults.empty()) {
			return MacroBindResult("Positional parameters cannot come after parameters with a default value!");
		} else {
			// positional argument
			positionals.push_back(std::move(arg));
		}
	}

	// check for each macro function if it matches the number of positional arguments
	optional_idx result_idx;
	for (idx_t function_idx = 0; function_idx < functions.size(); function_idx++) {
		if (functions[function_idx]->parameters.size() == positionals.size()) {
			// found a matching function
			result_idx = function_idx;
			break;
		}
	}
	if (!result_idx.IsValid()) {
		// no matching function found
		string error;
		if (functions.size() == 1) {
			// we only have one function - print the old more detailed error message
			auto &macro_def = *functions[0];
			auto &parameters = macro_def.parameters;
			error = StringUtil::Format("Macro function %s requires ", FormatMacroFunction(macro_def, name));
			error += parameters.size() == 1 ? "a single positional argument"
			                                : StringUtil::Format("%i positional arguments", parameters.size());
			error += ", but ";
			error += positionals.size() == 1 ? "a single positional argument was"
			                                 : StringUtil::Format("%i positional arguments were", positionals.size());
			error += " provided.";
		} else {
			// we have multiple functions - list all candidates
			error += StringUtil::Format("Macro \"%s\" does not support %llu parameters.\n", name, positionals.size());
			error += "Candidate macros:";
			for (auto &function : functions) {
				error += "\n\t" + FormatMacroFunction(*function, name);
			}
		}
		return MacroBindResult(error);
	}
	// found a matching index - check if the default values exist within the macro
	auto macro_idx = result_idx.GetIndex();
	auto &macro_def = *functions[macro_idx];
	for (auto &default_val : defaults) {
		auto entry = macro_def.default_parameters.find(default_val.first);
		if (entry == macro_def.default_parameters.end()) {
			string error =
			    StringUtil::Format("Macro \"%s\" does not have a named parameter \"%s\"\n", name, default_val.first);
			error += "\nMacro definition: " + FormatMacroFunction(macro_def, name);
			return MacroBindResult(error);
		}
	}
	// Add the default values for parameters that have defaults, that were not explicitly assigned to
	for (auto it = macro_def.default_parameters.begin(); it != macro_def.default_parameters.end(); it++) {
		auto &parameter_name = it->first;
		auto &parameter_default = it->second;
		if (!defaults.count(parameter_name)) {
			// This parameter was not set yet, set it with the default value
			defaults[parameter_name] = parameter_default->Copy();
		}
	}
	return MacroBindResult(macro_idx);
}